

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_spatializer_listener_config *
ma_spatializer_listener_config_init
          (ma_spatializer_listener_config *__return_storage_ptr__,ma_uint32 channelsOut)

{
  ma_vec3f mVar1;
  undefined8 local_38;
  float local_30;
  ma_uint32 channelsOut_local;
  
  memset(__return_storage_ptr__,0,0x30);
  __return_storage_ptr__->channelsOut = channelsOut;
  __return_storage_ptr__->pChannelMapOut = (ma_channel *)0x0;
  __return_storage_ptr__->handedness = ma_handedness_right;
  mVar1 = ma_vec3f_init_3f(0.0,1.0,0.0);
  local_38 = mVar1._0_8_;
  local_30 = mVar1.z;
  (__return_storage_ptr__->worldUp).x = (float)(undefined4)local_38;
  (__return_storage_ptr__->worldUp).y = (float)local_38._4_4_;
  (__return_storage_ptr__->worldUp).z = local_30;
  __return_storage_ptr__->coneInnerAngleInRadians = 6.283185;
  __return_storage_ptr__->coneOuterAngleInRadians = 6.283185;
  __return_storage_ptr__->coneOuterGain = 0.0;
  __return_storage_ptr__->speedOfSound = 343.3;
  return __return_storage_ptr__;
}

Assistant:

MA_API ma_spatializer_listener_config ma_spatializer_listener_config_init(ma_uint32 channelsOut)
{
    ma_spatializer_listener_config config;

    MA_ZERO_OBJECT(&config);
    config.channelsOut             = channelsOut;
    config.pChannelMapOut          = NULL;
    config.handedness              = ma_handedness_right;
    config.worldUp                 = ma_vec3f_init_3f(0, 1,  0);
    config.coneInnerAngleInRadians = 6.283185f; /* 360 degrees. */
    config.coneOuterAngleInRadians = 6.283185f; /* 360 degrees. */
    config.coneOuterGain           = 0;
    config.speedOfSound            = 343.3f;    /* Same as OpenAL. Used for doppler effect. */

    return config;
}